

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<trng::GF2,_521UL> * trng::operator*(matrix<trng::GF2,_521UL> *a,matrix<trng::GF2,_521UL> *b)

{
  GF2 GVar1;
  unsigned_long *puVar2;
  reference pvVar3;
  matrix<trng::GF2,_521UL> *in_RDI;
  size_type k_end;
  size_type k;
  GF2 sum;
  size_type j_end_1;
  size_type j_1;
  size_type i_1;
  size_type k0;
  size_type j_end;
  size_type j;
  size_type i;
  size_type j0;
  size_type step;
  matrix<trng::GF2,_521UL> *res;
  undefined5 in_stack_fffffffffffffef8;
  GF2 in_stack_fffffffffffffefd;
  GF2 in_stack_fffffffffffffefe;
  GF2 in_stack_fffffffffffffeff;
  matrix<trng::GF2,_521UL> *in_stack_ffffffffffffff00;
  matrix<trng::GF2,_521UL> *in_stack_ffffffffffffff20;
  unsigned_long local_c0 [2];
  ulong local_b0;
  ulong local_a8;
  GF2 local_99;
  unsigned_long local_98 [2];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  GF2 local_65 [13];
  unsigned_long local_58 [2];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  undefined1 local_19;
  
  local_19 = 0;
  matrix<trng::GF2,_521UL>::matrix(in_stack_ffffffffffffff20);
  local_28 = 0x20;
  for (local_30 = 0; local_30 < 0x209; local_30 = local_30 + 0x20) {
    for (local_38 = 0; local_38 < 0x209; local_38 = local_38 + 1) {
      local_40 = local_30;
      local_58[1] = 0x209;
      local_58[0] = local_30 + 0x20;
      puVar2 = utility::min<unsigned_long>(local_58 + 1,local_58);
      local_48 = *puVar2;
      for (; local_40 < local_48; local_40 = local_40 + 1) {
        GF2::GF2(local_65,0);
        pvVar3 = matrix<trng::GF2,_521UL>::operator()
                           (in_stack_ffffffffffffff00,
                            CONCAT17(in_stack_fffffffffffffeff.value,
                                     CONCAT16(in_stack_fffffffffffffefe.value,
                                              CONCAT15(in_stack_fffffffffffffefd.value,
                                                       in_stack_fffffffffffffef8))),0x2cf2fa);
        pvVar3->value = local_65[0].value;
      }
    }
    for (local_70 = 0; local_70 < 0x209; local_70 = local_70 + 0x20) {
      for (local_78 = 0; local_78 < 0x209; local_78 = local_78 + 1) {
        local_80 = local_30;
        local_98[1] = 0x209;
        local_98[0] = local_30 + 0x20;
        puVar2 = utility::min<unsigned_long>(local_98 + 1,local_98);
        local_88 = *puVar2;
        for (; local_80 < local_88; local_80 = local_80 + 1) {
          GF2::GF2(&local_99,0);
          local_a8 = local_70;
          local_c0[1] = 0x209;
          local_c0[0] = local_70 + 0x20;
          puVar2 = utility::min<unsigned_long>(local_c0 + 1,local_c0);
          local_b0 = *puVar2;
          for (; local_a8 < local_b0; local_a8 = local_a8 + 1) {
            matrix<trng::GF2,_521UL>::operator()
                      (in_stack_ffffffffffffff00,
                       CONCAT17(in_stack_fffffffffffffeff.value,
                                CONCAT16(in_stack_fffffffffffffefe.value,
                                         CONCAT15(in_stack_fffffffffffffefd.value,
                                                  in_stack_fffffffffffffef8))),0x2cf483);
            in_stack_ffffffffffffff00 =
                 (matrix<trng::GF2,_521UL> *)
                 matrix<trng::GF2,_521UL>::operator()
                           (in_stack_ffffffffffffff00,
                            CONCAT17(in_stack_fffffffffffffeff.value,
                                     CONCAT16(in_stack_fffffffffffffefe.value,
                                              CONCAT15(in_stack_fffffffffffffefd.value,
                                                       in_stack_fffffffffffffef8))),0x2cf4af);
            in_stack_fffffffffffffeff = operator*((GF2)0x0,(GF2)0x0);
            in_stack_fffffffffffffefe = operator+((GF2)0x0,(GF2)0x0);
            local_99 = in_stack_fffffffffffffefe;
          }
          matrix<trng::GF2,_521UL>::operator()
                    (in_stack_ffffffffffffff00,
                     CONCAT17(in_stack_fffffffffffffeff.value,
                              CONCAT16(in_stack_fffffffffffffefe.value,
                                       CONCAT15(in_stack_fffffffffffffefd.value,
                                                in_stack_fffffffffffffef8))),0x2cf530);
          GVar1 = operator+((GF2)0x0,(GF2)0x0);
          in_stack_fffffffffffffefd = GVar1;
          pvVar3 = matrix<trng::GF2,_521UL>::operator()
                             (in_stack_ffffffffffffff00,
                              CONCAT17(in_stack_fffffffffffffeff.value,
                                       CONCAT16(in_stack_fffffffffffffefe.value,
                                                CONCAT15(GVar1.value,in_stack_fffffffffffffef8))),
                              0x2cf575);
          pvVar3->value = GVar1.value;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }